

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O3

ScalarFunction * duckdb::LikeEscapeFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef4;
  FunctionNullHandling in_stack_ffffffffffffff00;
  allocator_type local_f9;
  code *bind_lambda;
  LogicalType local_d8;
  vector<duckdb::LogicalType,_true> local_c0;
  string local_a8;
  LogicalType local_88;
  LogicalType local_70 [3];
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"like_escape","");
  LogicalType::LogicalType(local_70,VARCHAR);
  LogicalType::LogicalType(local_70 + 1,VARCHAR);
  LogicalType::LogicalType(local_70 + 2,VARCHAR);
  __l._M_len = 3;
  __l._M_array = local_70;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_c0,__l,
             &local_f9);
  LogicalType::LogicalType(&local_d8,BOOLEAN);
  bind_lambda = LikeEscapeFunction<duckdb::LikeEscapeOperator>;
  LogicalType::LogicalType(&local_88,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_88;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffeec;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffef4;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_a8,&local_c0,&local_d8,(scalar_function_t *)&stack0xffffffffffffff08,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_ffffffffffffff00,bind_lambda);
  LogicalType::~LogicalType(&local_88);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff08,(_Any_data *)&stack0xffffffffffffff08,
               __destroy_functor);
  LogicalType::~LogicalType(&local_d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_c0);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_70[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  (in_RDI->super_BaseScalarFunction).collation_handling = PUSH_COMBINABLE_COLLATIONS;
  return in_RDI;
}

Assistant:

ScalarFunction LikeEscapeFun::GetFunction() {
	ScalarFunction like_escape("like_escape", {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR},
	                           LogicalType::BOOLEAN, LikeEscapeFunction<LikeEscapeOperator>);
	like_escape.collation_handling = FunctionCollationHandling::PUSH_COMBINABLE_COLLATIONS;
	return like_escape;
}